

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_cid.c
# Opt level: O0

size_t unregister_prior_to(quicly_remote_cid_set_t *set,uint64_t seq_unreg_prior_to,
                          uint64_t *unregistered_seqs)

{
  long in_RDX;
  ulong in_RSI;
  int *in_RDI;
  size_t i;
  size_t num_unregistered;
  uint64_t min_seq_idx;
  uint64_t min_seq;
  ulong idx_to_promote;
  quicly_remote_cid_set_t *set_00;
  quicly_remote_cid_set_t *set_01;
  ulong local_28;
  ulong local_20;
  
  local_20 = 0xffffffffffffffff;
  local_28 = 0xffffffffffffffff;
  set_00 = (quicly_remote_cid_set_t *)0x0;
  for (idx_to_promote = 0; idx_to_promote < 4; idx_to_promote = idx_to_promote + 1) {
    if (in_RDI[idx_to_promote * 0xe] != 0) {
      if (*(ulong *)(in_RDI + idx_to_promote * 0xe + 2) < in_RSI) {
        set_01 = (quicly_remote_cid_set_t *)((long)&set_00->cids[0].is_active + 1);
        *(undefined8 *)(in_RDX + (long)set_00 * 8) =
             *(undefined8 *)(in_RDI + idx_to_promote * 0xe + 2);
        do_unregister(set_01,idx_to_promote);
        set_00 = set_01;
      }
      else if (*(ulong *)(in_RDI + idx_to_promote * 0xe + 2) < local_20) {
        local_20 = *(ulong *)(in_RDI + idx_to_promote * 0xe + 2);
        local_28 = idx_to_promote;
      }
    }
  }
  if ((*in_RDI == 0) && (local_28 != 0xffffffffffffffff)) {
    promote_cid(set_00,idx_to_promote);
  }
  return (size_t)set_00;
}

Assistant:

static size_t unregister_prior_to(quicly_remote_cid_set_t *set, uint64_t seq_unreg_prior_to,
                                  uint64_t unregistered_seqs[QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT])
{
    uint64_t min_seq = UINT64_MAX, min_seq_idx = UINT64_MAX;
    size_t num_unregistered = 0;
    for (size_t i = 0; i < PTLS_ELEMENTSOF(set->cids); i++) {
        if (set->cids[i].is_active) {
            if (set->cids[i].sequence < seq_unreg_prior_to) {
                unregistered_seqs[num_unregistered++] = set->cids[i].sequence;
                do_unregister(set, i);
                continue;
            }
            if (min_seq > set->cids[i].sequence) {
                /* find a CID with minimum sequence number, while iterating over the array */
                min_seq = set->cids[i].sequence;
                min_seq_idx = i;
            }
        }
    }

    if (!set->cids[0].is_active) {
        /* we have retired the current CID (idx=0) */
        if (min_seq_idx != UINT64_MAX)
            promote_cid(set, min_seq_idx);
    }

    return num_unregistered;
}